

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::test(FastText *this,istream *in,int32_t k,real threshold,Meter *meter)

{
  bool bVar1;
  int32_t outputSize;
  int iVar2;
  element_type *peVar3;
  element_type *this_00;
  Meter *in_RCX;
  pointer in_RSI;
  uint in_XMM0_Da;
  double __x;
  State state;
  Predictions predictions;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  State *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  int32_t in_stack_ffffffffffffff2c;
  State *in_stack_ffffffffffffff30;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  real in_stack_ffffffffffffff84;
  istream *in_stack_ffffffffffffff88;
  Dictionary *in_stack_ffffffffffffff90;
  int32_t in_stack_ffffffffffffff9c;
  FastText *in_stack_ffffffffffffffa0;
  Meter *local_20;
  uint local_18;
  pointer local_10;
  
  local_20 = in_RCX;
  local_18 = in_XMM0_Da;
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b6699);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b66a6);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)0x1b66b3);
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b66bd);
  iVar2 = peVar3->dim;
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b66d5);
  outputSize = Dictionary::nlabels(this_00);
  Model::State::State(in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,outputSize,iVar2);
  std::ios::clear((long)local_10 + *(long *)(*(long *)local_10 + -0x18),0);
  std::istream::seekg((long)local_10,_S_beg);
  while (iVar2 = std::istream::peek(), iVar2 != -1) {
    in_stack_ffffffffffffff00 = (State *)&stack0xffffffffffffffc8;
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1b675b);
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1b676d);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1b677b);
    Dictionary::getLine(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                        (vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    bVar1 = std::vector<int,_std::allocator<int>_>::empty
                      ((vector<int,_std::allocator<int>_> *)
                       CONCAT44(iVar2,in_stack_ffffffffffffff10));
    if ((!bVar1) &&
       (bVar1 = std::vector<int,_std::allocator<int>_>::empty
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(iVar2,in_stack_ffffffffffffff10)), !bVar1)) {
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::clear
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)0x1b67d2)
      ;
      __x = (double)(ulong)local_18;
      predict(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
              (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff90,
              (Predictions *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff84);
      Meter::log(local_20,__x);
    }
  }
  Model::State::~State(in_stack_ffffffffffffff00);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~vector
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
             CONCAT44(iVar2,in_stack_ffffffffffffff10));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_ffffffffffffff10));
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_ffffffffffffff10));
  return;
}

Assistant:

void FastText::test(std::istream& in, int32_t k, real threshold, Meter& meter)
    const {
  std::vector<int32_t> line;
  std::vector<int32_t> labels;
  Predictions predictions;
  Model::State state(args_->dim, dict_->nlabels(), 0);
  in.clear();
  in.seekg(0, std::ios_base::beg);

  while (in.peek() != EOF) {
    line.clear();
    labels.clear();
    dict_->getLine(in, line, labels);

    if (!labels.empty() && !line.empty()) {
      predictions.clear();
      predict(k, line, predictions, threshold);
      meter.log(labels, predictions);
    }
  }
}